

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O0

TCPClient * __thiscall
TCPClient::Sendnix(TCPClient *this,string *hostname,string *portNumber,string *message)

{
  int __fd;
  char *pcVar1;
  char *__service;
  size_t sVar2;
  void *__buf;
  ssize_t sVar3;
  string *in_R8;
  allocator local_4c2;
  allocator local_4c1;
  undefined4 local_4c0;
  allocator local_4b9;
  char local_4b8 [8];
  char incomming_data_buffer [1000];
  ssize_t bytes_recieved;
  ssize_t bytes_sent;
  string local_b0 [4];
  int len;
  string msg;
  allocator local_8a;
  allocator local_89;
  int local_88;
  int socketfd;
  allocator local_71;
  addrinfo *local_70;
  addrinfo *host_info_list;
  addrinfo host_info;
  int status;
  string *message_local;
  string *portNumber_local;
  string *hostname_local;
  TCPClient *this_local;
  
  memset(&host_info_list,0,0x30);
  host_info_list._4_4_ = 0;
  host_info.ai_flags = 1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  host_info.ai_next._4_4_ = getaddrinfo(pcVar1,__service,(addrinfo *)&host_info_list,&local_70);
  if (host_info.ai_next._4_4_ == 0) {
    local_88 = socket(local_70->ai_family,local_70->ai_socktype,local_70->ai_protocol);
    if (local_88 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"ERROR: Could not open socket",&local_89);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    else {
      host_info.ai_next._4_4_ = connect(local_88,local_70->ai_addr,local_70->ai_addrlen);
      if (host_info.ai_next._4_4_ == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"ERROR: Could not connect",&local_8a);
        std::allocator<char>::~allocator((allocator<char> *)&local_8a);
      }
      else {
        std::__cxx11::string::string(local_b0,in_R8);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        sVar2 = strlen(pcVar1);
        __fd = local_88;
        __buf = (void *)std::__cxx11::string::c_str();
        send(__fd,__buf,(long)(int)sVar2,0);
        sVar3 = recv(local_88,local_4b8,1000,0);
        if (sVar3 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"ERROR: Host shut down",&local_4b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
        }
        else if (sVar3 == -1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"ERROR: Error when recieving",&local_4c1);
          std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
        }
        else {
          local_4b8[sVar3] = '\0';
          freeaddrinfo(local_70);
          close(local_88);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,local_4b8,&local_4c2);
          std::allocator<char>::~allocator((allocator<char> *)&local_4c2);
        }
        local_4c0 = 1;
        std::__cxx11::string::~string(local_b0);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ERROR: Hostname could not be resolved",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return this;
}

Assistant:

string TCPClient::Sendnix(string hostname, string portNumber, string message) {
  // TCP client
  int status;
  // The struct that getaddrinfo() fills up with data.
  struct addrinfo host_info;
  // Pointer to the to the linked list of host_info's.
  struct addrinfo *host_info_list;

  /* The MAN page of getaddrinfo() states "All  the other fields in the structure pointed
  to by hints must contain either 0 or a null pointer, as appropriate." When a struct
  is created in c++, it will be given a block of memory. This memory is not nessesary
  empty. Therefor we use the memset function to make sure all fields are NULL.
  */
  memset(&host_info, 0, sizeof host_info);

  host_info.ai_family = AF_UNSPEC;     // IP version not specified. Can be both.
  // Use SOCK_STREAM for TCP or SOCK_DGRAM for UDP.
  host_info.ai_socktype = SOCK_STREAM;

  /* Now fill up the linked list of host_info structs with google's address information.
  status = getaddrinfo("www.google.com", "80", &host_info, &host_info_list);*/
  status = getaddrinfo(hostname.c_str(), portNumber.c_str(), &host_info,
                        &host_info_list);
  // getaddrinfo returns 0 on succes, or some other value when an error occured.
  // (translated into human readable text by the gai_gai_strerror function).
  if (status != 0) {
    return std::string("ERROR: Hostname could not be resolved");
  }

  int socketfd;  // The socket descripter
  socketfd = socket(host_info_list->ai_family, host_info_list->ai_socktype,
                    host_info_list->ai_protocol);
  if (socketfd == -1) {
    return std::string("ERROR: Could not open socket");
  }

  status = connect(socketfd, host_info_list->ai_addr,
                    host_info_list->ai_addrlen);
  if (status == -1) {
    return std::string("ERROR: Could not connect");
  }

  std::string msg = message;
  int len;
  ssize_t bytes_sent;
  len = strlen(msg.c_str());
  bytes_sent = send(socketfd, msg.c_str(), len, 0);

  ssize_t bytes_recieved;
  char incomming_data_buffer[1000];
  bytes_recieved = recv(socketfd, incomming_data_buffer, 1000, 0);
  /*If no data arrives, the program will just wait here until
  some data arrives.*/
  if (bytes_recieved == 0) {
    return std::string("ERROR: Host shut down");
  }
  if (bytes_recieved == -1) {
    return std::string("ERROR: Error when recieving");
  }
  incomming_data_buffer[bytes_recieved] = '\0';

  freeaddrinfo(host_info_list);

  close(socketfd);

  return std::string(incomming_data_buffer);
}